

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

int __thiscall serial::Serial::SerialImpl::open(SerialImpl *this,char *__file,int __oflag,...)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  invalid_argument *this_00;
  SerialException *this_01;
  char *__file_00;
  int *piVar4;
  IOException *pIVar5;
  int __oflag_00;
  char *__file_01;
  allocator local_69;
  string local_68;
  undefined1 local_42;
  allocator local_41;
  string local_40;
  SerialImpl *local_10;
  SerialImpl *this_local;
  
  local_10 = this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Empty port is invalid.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((this->is_open_ & 1U) == 1) {
    this_01 = (SerialException *)__cxa_allocate_exception(0x28);
    SerialException::SerialException(this_01,"Serial port already open.");
    __cxa_throw(this_01,&SerialException::typeinfo,SerialException::~SerialException);
  }
  __file_00 = (char *)std::__cxx11::string::c_str();
  __file_01 = (char *)0x902;
  iVar1 = ::open(__file_00,0x902);
  this->fd_ = iVar1;
  if (this->fd_ == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 4) {
      if (1 < *piVar4 - 0x17U) {
        pIVar5 = (IOException *)__cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
                   ,&local_69);
        piVar4 = __errno_location();
        IOException::IOException(pIVar5,&local_68,0x97,*piVar4);
        __cxa_throw(pIVar5,&IOException::typeinfo,IOException::~IOException);
      }
      local_42 = 1;
      pIVar5 = (IOException *)__cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/impl/unix.cc"
                 ,&local_41);
      IOException::IOException(pIVar5,&local_40,0x95,"Too many file handles open.");
      local_42 = 0;
      __cxa_throw(pIVar5,&IOException::typeinfo,IOException::~IOException);
    }
    uVar2 = open(this,__file_01,__oflag_00);
    this = (SerialImpl *)(ulong)uVar2;
  }
  else {
    reconfigurePort(this);
    this->is_open_ = true;
  }
  return (int)this;
}

Assistant:

void
Serial::SerialImpl::open ()
{
  if (port_.empty ()) {
    throw invalid_argument ("Empty port is invalid.");
  }
  if (is_open_ == true) {
    throw SerialException ("Serial port already open.");
  }

  fd_ = ::open (port_.c_str(), O_RDWR | O_NOCTTY | O_NONBLOCK);

  if (fd_ == -1) {
    switch (errno) {
    case EINTR:
      // Recurse because this is a recoverable error.
      open ();
      return;
    case ENFILE:
    case EMFILE:
      THROW (IOException, "Too many file handles open.");
    default:
      THROW (IOException, errno);
    }
  }

  reconfigurePort();
  is_open_ = true;
}